

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Memory> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Memory,wabt::interp::Store&,wabt::interp::MemoryType&>
          (RefPtr<wabt::interp::Memory> *__return_storage_ptr__,Store *this,Store *args,
          MemoryType *args_1)

{
  Memory *this_00;
  Ref ref;
  Store *pSVar1;
  Memory *local_58;
  MemoryType local_50;
  
  pSVar1 = this;
  this_00 = (Memory *)operator_new(0x88);
  local_50.super_ExternType.kind = (args_1->super_ExternType).kind;
  local_50.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001b2250;
  local_50.limits.has_max = (args_1->limits).has_max;
  local_50.limits.is_shared = (args_1->limits).is_shared;
  local_50.limits._18_6_ = *(undefined6 *)&(args_1->limits).field_0x12;
  local_50.limits.initial = (args_1->limits).initial;
  local_50.limits.max = (args_1->limits).max;
  Memory::Memory(this_00,pSVar1,&local_50);
  local_58 = this_00;
  ref.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
              ::New<wabt::interp::Memory*>
                        ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                          *)&this->objects_,&local_58);
  RefPtr<wabt::interp::Memory>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}